

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_header.cpp
# Opt level: O0

bool __thiscall BamTools::HeaderTool::HeaderToolPrivate::Run(HeaderToolPrivate *this)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  istream *piVar5;
  long *in_RDI;
  BamMultiReader reader;
  string line;
  ifstream filelist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd38;
  ostream *in_stack_fffffffffffffd40;
  value_type *in_stack_fffffffffffffd48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd50;
  string local_270 [32];
  BamMultiReader local_250;
  string local_248 [32];
  int local_228;
  istream local_218 [535];
  byte local_1;
  
  if (((*(byte *)*in_RDI & 1) == 0) && ((*(byte *)(*in_RDI + 1) & 1) == 0)) {
    Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  }
  if ((*(byte *)(*in_RDI + 1) & 1) != 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_218,pcVar3,_S_in);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,
                               "bamtools header ERROR: could not open input BAM file list... Aborting."
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      local_228 = 1;
    }
    else {
      std::__cxx11::string::string(local_248);
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_248)
        ;
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar2) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      }
      std::__cxx11::string::~string(local_248);
      local_228 = 0;
    }
    std::ifstream::~ifstream(local_218);
    if (local_228 != 0) goto LAB_0021c094;
  }
  BamMultiReader::BamMultiReader(&local_250);
  bVar2 = BamMultiReader::Open
                    ((BamMultiReader *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  if (bVar2) {
    BamMultiReader::GetHeaderText_abi_cxx11_((BamMultiReader *)in_stack_fffffffffffffd38);
    in_stack_fffffffffffffd40 = std::operator<<((ostream *)&std::cout,local_270);
    std::ostream::operator<<(in_stack_fffffffffffffd40,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_270);
    BamMultiReader::Close((BamMultiReader *)0x21c045);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "bamtools header ERROR: could not open BAM file(s) for reading... Aborting."
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_228 = 1;
  local_1 = bVar2;
  BamMultiReader::~BamMultiReader((BamMultiReader *)in_stack_fffffffffffffd40);
LAB_0021c094:
  return (bool)(local_1 & 1);
}

Assistant:

bool HeaderTool::HeaderToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist)
        m_settings->InputFiles.push_back(Options::StandardIn());

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools header ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line))
            m_settings->InputFiles.push_back(line);
    }

    // attemp to open BAM files
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools header ERROR: could not open BAM file(s) for reading... Aborting."
                  << std::endl;
        return false;
    }

    // dump (merged) header contents to stdout
    std::cout << reader.GetHeaderText() << std::endl;

    // clean up & exit
    reader.Close();
    return true;
}